

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.cpp
# Opt level: O1

bool compare(string *left,string *right,bool sensitive)

{
  size_t __n;
  int iVar1;
  undefined7 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000011,sensitive) == 0) {
    iVar1 = strcasecmp((left->_M_dataplus)._M_p,(right->_M_dataplus)._M_p);
  }
  else {
    __n = left->_M_string_length;
    if (__n != right->_M_string_length) {
      return false;
    }
    if (__n == 0) {
      return true;
    }
    iVar1 = bcmp((left->_M_dataplus)._M_p,(right->_M_dataplus)._M_p,__n);
  }
  return iVar1 == 0;
}

Assistant:

bool compare (
  const std::string& left,
  const std::string& right,
  bool sensitive /*= true*/)
{
  // Use strcasecmp if required.
  if (! sensitive)
    return strcasecmp (left.c_str (), right.c_str ()) == 0 ? true : false;

  // Otherwise, just use std::string::operator==.
  return left == right;
}